

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::operator==
          (Underwater_Acoustic_PDU *this,Underwater_Acoustic_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Underwater_Acoustic_PDU *Value_local;
  Underwater_Acoustic_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                      (&this->m_EmittingEntityID,&Value->m_EmittingEntityID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else if (this->m_ui8StateUpdateIndicator == Value->m_ui8StateUpdateIndicator) {
        if (this->m_ui16PassiveParamIndex == Value->m_ui16PassiveParamIndex) {
          if (this->m_ui8PropPlantConfig == Value->m_ui8PropPlantConfig) {
            if (this->m_ui8NumShafts == Value->m_ui8NumShafts) {
              if (this->m_ui8NumAPA == Value->m_ui8NumAPA) {
                if (this->m_ui8NumEmitterSys == Value->m_ui8NumEmitterSys) {
                  bVar2 = std::operator!=(&this->m_vShafts,&Value->m_vShafts);
                  if (bVar2) {
                    this_local._7_1_ = false;
                  }
                  else {
                    bVar2 = std::operator!=(&this->m_vAPA,&Value->m_vAPA);
                    if (bVar2) {
                      this_local._7_1_ = false;
                    }
                    else {
                      bVar2 = std::operator!=(&this->m_vUAES,&Value->m_vUAES);
                      if (bVar2) {
                        this_local._7_1_ = false;
                      }
                      else {
                        this_local._7_1_ = true;
                      }
                    }
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Underwater_Acoustic_PDU::operator == ( const Underwater_Acoustic_PDU & Value ) const
{
    if( Header::operator          !=( Value ) )                         return false;
    if( m_EmittingEntityID        != Value.m_EmittingEntityID )         return false;
    if( m_EventID                 != Value.m_EventID )                  return false;
    if( m_ui8StateUpdateIndicator != Value.m_ui8StateUpdateIndicator )  return false;
    if( m_ui16PassiveParamIndex   != Value.m_ui16PassiveParamIndex )    return false;
    if( m_ui8PropPlantConfig      != Value.m_ui8PropPlantConfig )       return false;
    if( m_ui8NumShafts            != Value.m_ui8NumShafts )             return false;
    if( m_ui8NumAPA               != Value.m_ui8NumAPA )                return false;
    if( m_ui8NumEmitterSys        != Value.m_ui8NumEmitterSys )         return false;
    if( m_vShafts                 != Value.m_vShafts )                  return false;
    if( m_vAPA                    != Value.m_vAPA )                     return false;
    if( m_vUAES                   != Value.m_vUAES )                   return false;
    return true;
}